

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondTypeParser.cpp
# Opt level: O0

BondType * __thiscall
OpenMD::BondTypeParser::parseLine(BondTypeParser *this,string *line,RealType kScale)

{
  BondTypeEnum BVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *__s;
  StringTokenizer *pSVar4;
  string *msg;
  double in_XMM0_Qa;
  RealType RVar5;
  int mAtt;
  int nRep;
  RealType epsilon;
  RealType sigma;
  RealType beta;
  RealType D;
  RealType b0_5;
  int i;
  PolynomialBondType *pbt;
  RealType coefficient;
  int power;
  int nPairs;
  RealType b0_4;
  RealType k0_1;
  RealType k1_1;
  RealType k2_1;
  RealType k3_1;
  RealType k4;
  RealType b0_3;
  RealType k0;
  RealType k1;
  RealType k2;
  RealType k3;
  RealType b0_2;
  RealType kb;
  RealType b0_1;
  RealType b0;
  BondTypeEnum bt;
  int nTokens;
  BondType *bondType;
  StringTokenizer tokenizer;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  PolynomialBondType *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  StringTokenizer *in_stack_fffffffffffffb50;
  OpenMDException *this_00;
  string *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  RealType in_stack_fffffffffffffb68;
  QuarticBondType *in_stack_fffffffffffffb70;
  string *in_stack_fffffffffffffb78;
  StringTokenizer *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_fffffffffffffb88;
  RealType in_stack_fffffffffffffb90;
  RealType in_stack_fffffffffffffb98;
  ShiftedMieBondType *in_stack_fffffffffffffba0;
  StringTokenizer *in_stack_fffffffffffffbe8;
  undefined1 local_301 [41];
  RealType local_2d8;
  RealType local_2d0;
  undefined1 local_2c2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c1;
  RealType local_2a0;
  RealType local_298;
  RealType local_290;
  undefined1 local_282;
  int local_25c;
  void *local_258;
  RealType local_250;
  int local_248;
  int local_244;
  RealType local_240;
  undefined1 local_232;
  RealType local_210;
  RealType local_208;
  RealType local_200;
  RealType local_1f8;
  RealType local_1f0;
  RealType local_1e8;
  undefined1 local_1da;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  undefined1 local_18a;
  double local_168;
  RealType local_160;
  undefined1 local_152;
  RealType local_130;
  undefined1 local_122;
  string local_100 [32];
  BondTypeEnum local_e0;
  undefined1 local_da;
  int local_b4;
  StringTokenizer *local_b0;
  allocator<char> local_91;
  string local_90 [120];
  double local_18;
  
  local_18 = in_XMM0_Qa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
             (allocator<char> *)in_stack_fffffffffffffb70);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,(string *)in_stack_fffffffffffffb70
            );
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_b0 = (StringTokenizer *)0x0;
  local_b4 = StringTokenizer::countTokens(in_stack_fffffffffffffb50);
  if (local_b4 < 1) {
    local_da = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
               (allocator<char> *)in_stack_fffffffffffffb70);
    OpenMDException::OpenMDException
              ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    local_da = 0;
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffbe8);
  BVar1 = getBondTypeEnum((BondTypeParser *)
                          CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                          in_stack_fffffffffffffb58);
  std::__cxx11::string::~string(local_100);
  local_b4 = local_b4 + -1;
  local_e0 = BVar1;
  switch(BVar1) {
  case btFixed:
    if (local_b4 < 1) {
      local_122 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_122 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_130 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    pSVar4 = (StringTokenizer *)operator_new(0x10);
    FixedBondType::FixedBondType
              ((FixedBondType *)in_stack_fffffffffffffb40,
               (RealType)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_b0 = pSVar4;
    break;
  case btHarmonic:
    if (local_b4 < 2) {
      local_152 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_152 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_160 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_168 = RVar5 * local_18;
    pSVar4 = (StringTokenizer *)operator_new(0x18);
    HarmonicBondType::HarmonicBondType
              ((HarmonicBondType *)in_stack_fffffffffffffb50,(RealType)in_stack_fffffffffffffb48,
               (RealType)in_stack_fffffffffffffb40);
    local_b0 = pSVar4;
    break;
  case btCubic:
    if (local_b4 < 5) {
      local_18a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_18a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_198 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1a0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1a8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1b0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1b8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    pSVar4 = (StringTokenizer *)operator_new(0x30);
    CubicBondType::CubicBondType
              ((CubicBondType *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (RealType)in_stack_fffffffffffffb58,(RealType)in_stack_fffffffffffffb50,
               (RealType)in_stack_fffffffffffffb48,(RealType)in_stack_fffffffffffffb40,
               (RealType)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_b0 = pSVar4;
    break;
  case btQuartic:
    if (local_b4 < 6) {
      local_1da = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_1da = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1e8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1f0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_1f8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_200 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_208 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_210 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    pSVar4 = (StringTokenizer *)operator_new(0x38);
    QuarticBondType::QuarticBondType
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (RealType)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (RealType)in_stack_fffffffffffffb58,(RealType)in_stack_fffffffffffffb50,
               (RealType)in_stack_fffffffffffffb48,(RealType)in_stack_fffffffffffffb40);
    local_b0 = pSVar4;
    break;
  case btPolynomial:
    if ((local_b4 < 3) || (local_b4 % 2 != 1)) {
      local_232 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_232 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_240 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_b4 = local_b4 + -1;
    local_244 = local_b4 / 2;
    pvVar3 = operator_new(0x40);
    PolynomialBondType::PolynomialBondType
              ((PolynomialBondType *)in_stack_fffffffffffffb50,(RealType)in_stack_fffffffffffffb48);
    local_258 = pvVar3;
    for (local_25c = 0; local_25c < local_244; local_25c = local_25c + 1) {
      local_248 = StringTokenizer::nextTokenAsInt
                            ((StringTokenizer *)
                             CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
      local_250 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
      PolynomialBondType::setCoefficient
                (in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,1.98681039083805e-317);
    }
    break;
  case btMorse:
    if (local_b4 < 3) {
      local_282 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
                 (allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_282 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_290 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_298 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_2a0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    pSVar4 = (StringTokenizer *)operator_new(0x20);
    MorseBondType::MorseBondType
              ((MorseBondType *)in_stack_fffffffffffffb50,(RealType)in_stack_fffffffffffffb48,
               (RealType)in_stack_fffffffffffffb40,
               (RealType)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    local_b0 = pSVar4;
    break;
  case btShiftedMie:
    if (local_b4 < 4) {
      local_2c2 = 1;
      __s = (char *)__cxa_allocate_exception(0x28);
      this_01 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,__s,(allocator<char> *)in_stack_fffffffffffffb70);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_2c2 = 0;
      __cxa_throw(__s,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_2d0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_2d8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffb80);
    local_301._37_4_ =
         StringTokenizer::nextTokenAsInt
                   ((StringTokenizer *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                   );
    local_301._33_4_ =
         StringTokenizer::nextTokenAsInt
                   ((StringTokenizer *)CONCAT44(local_301._37_4_,in_stack_fffffffffffffb60));
    pSVar4 = (StringTokenizer *)operator_new(0x40);
    ShiftedMieBondType::ShiftedMieBondType
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(int)in_stack_fffffffffffffb88);
    local_b0 = pSVar4;
    break;
  case btUnknown:
  default:
    msg = (string *)__cxa_allocate_exception(0x28);
    this_00 = (OpenMDException *)local_301;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffb80->tokenString_,(char *)in_stack_fffffffffffffb78,
               (allocator<char> *)in_stack_fffffffffffffb70);
    OpenMDException::OpenMDException(this_00,msg);
    __cxa_throw(msg,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(local_b0);
  return (BondType *)local_b0;
}

Assistant:

BondType* BondTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BondType* bondType = NULL;
    int nTokens        = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("BondTypeParser: Not enough tokens");
    }

    BondTypeEnum bt = getBondTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    switch (bt) {
    case btFixed:
      if (nTokens < 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        bondType    = new FixedBondType(b0);
      }
      break;

    case btHarmonic:
      if (nTokens < 2) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType kb = tokenizer.nextTokenAsDouble();
        kb *= kScale;
        bondType = new HarmonicBondType(b0, kb);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new CubicBondType(b0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bondType = new QuarticBondType(b0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial:

      if (nTokens < 3 || nTokens % 2 != 1) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0 = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBondType* pbt = new PolynomialBondType(b0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }

      break;

    case btMorse:
      if (nTokens < 3) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType b0   = tokenizer.nextTokenAsDouble();
        RealType D    = tokenizer.nextTokenAsDouble();
        RealType beta = tokenizer.nextTokenAsDouble();
        bondType      = new MorseBondType(b0, D, beta);
      }
      break;

    case btShiftedMie:
      if (nTokens < 4) {
        throw OpenMDException("BondTypeParser: Not enough tokens");
      } else {
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();

        bondType = new ShiftedMieBondType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BondTypeParser: Unknown Bond Type");
    }

    return bondType;
  }